

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::columnsInserted
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  SizeAdjustPolicy SVar1;
  long *plVar2;
  char cVar3;
  long in_FS_OFFSET;
  code *local_60;
  undefined8 local_58;
  long *local_50;
  undefined8 local_48;
  undefined4 local_40;
  int iStack_3c;
  undefined4 uStack_38;
  int iStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  if ((*(byte *)(plVar2[4] + 9) & 0x80) != 0) {
    (**(code **)(*plVar2 + 0x260))(plVar2);
  }
  cVar3 = QAccessible::isActive();
  if (cVar3 != '\0') {
    local_48 = 0x3ffffffff;
    local_60 = QIcon::QIcon;
    local_40 = 0xffffffff;
    uStack_38 = 0xffffffff;
    local_58 = 0xaaaaaaaa00000116;
    local_50 = plVar2;
    iStack_3c = start;
    iStack_34 = end;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)&local_60);
  }
  SVar1 = (this->super_QAbstractScrollAreaPrivate).sizeAdjustPolicy;
  if ((SVar1 != AdjustIgnored) &&
     ((SVar1 == AdjustToContents || ((this->super_QAbstractScrollAreaPrivate).shownOnce == false))))
  {
    QWidget::updateGeometry
              (*(QWidget **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::columnsInserted(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

    Q_Q(QAbstractItemView);
    if (q->isVisible())
        q->updateEditorGeometries();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::ColumnsInserted);
        accessibleEvent.setFirstColumn(start);
        accessibleEvent.setLastColumn(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}